

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_simple.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::DuckCatalog::BindAlterAddIndex
          (DuckCatalog *this,Binder *binder,TableCatalogEntry *table_entry,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *plan,unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
                *create_info,
          unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>,_true>
          *alter_info)

{
  unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
  *create_index_info;
  long *plVar1;
  long *in_stack_00000008;
  IndexBinder index_binder;
  CreateIndexInfo *local_b8;
  undefined1 local_b0 [8];
  
  IndexBinder::IndexBinder
            ((IndexBinder *)&stack0xffffffffffffff58,(Binder *)table_entry,
             *(ClientContext **)
              &(table_entry->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.type,
             (optional_ptr<duckdb::TableCatalogEntry,_true>)0x0,
             (optional_ptr<duckdb::CreateIndexInfo,_true>)0x0);
  create_index_info =
       *(unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true> **)
        &(table_entry->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.type;
  local_b0 = (undefined1  [8])
             (alter_info->
             super_unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)
             ._M_t.
             super___uniq_ptr_impl<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::AlterTableInfo_*,_std::default_delete<duckdb::AlterTableInfo>_>
             .super__Head_base<0UL,_duckdb::AlterTableInfo_*,_false>._M_head_impl;
  (alter_info->
  super_unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)._M_t.
  super___uniq_ptr_impl<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::AlterTableInfo_*,_std::default_delete<duckdb::AlterTableInfo>_>.
  super__Head_base<0UL,_duckdb::AlterTableInfo_*,_false>._M_head_impl = (AlterTableInfo *)0x0;
  local_b8 = (create_info->
             super_unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::CreateIndexInfo_*,_std::default_delete<duckdb::CreateIndexInfo>_>
             .super__Head_base<0UL,_duckdb::CreateIndexInfo_*,_false>._M_head_impl;
  (create_info->
  super_unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>_>)._M_t.
  super___uniq_ptr_impl<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::CreateIndexInfo_*,_std::default_delete<duckdb::CreateIndexInfo>_>.
  super__Head_base<0UL,_duckdb::CreateIndexInfo_*,_false>._M_head_impl = (CreateIndexInfo *)0x0;
  plVar1 = (long *)*in_stack_00000008;
  *in_stack_00000008 = 0;
  IndexBinder::BindCreateIndex
            ((IndexBinder *)this,(ClientContext *)&stack0xffffffffffffff58,create_index_info,
             (TableCatalogEntry *)local_b0,plan,
             (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>,_true>)
             &local_b8);
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
  }
  if (local_b8 != (CreateIndexInfo *)0x0) {
    (**(code **)((long)(local_b8->super_CreateInfo).super_ParseInfo._vptr_ParseInfo + 8))();
  }
  local_b8 = (CreateIndexInfo *)0x0;
  if (local_b0 != (undefined1  [8])0x0) {
    (*(((AlterInfo *)local_b0)->super_ParseInfo)._vptr_ParseInfo[1])();
  }
  local_b0 = (undefined1  [8])0x0;
  ExpressionBinder::~ExpressionBinder((ExpressionBinder *)&stack0xffffffffffffff58);
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> DuckCatalog::BindAlterAddIndex(Binder &binder, TableCatalogEntry &table_entry,
                                                           unique_ptr<LogicalOperator> plan,
                                                           unique_ptr<CreateIndexInfo> create_info,
                                                           unique_ptr<AlterTableInfo> alter_info) {
	D_ASSERT(plan->type == LogicalOperatorType::LOGICAL_GET);
	IndexBinder index_binder(binder, binder.context);
	return index_binder.BindCreateIndex(binder.context, std::move(create_info), table_entry, std::move(plan),
	                                    std::move(alter_info));
}